

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
          (QMovableArrayOps<QByteArray> *this,qsizetype i,QByteArray *args)

{
  qsizetype *pqVar1;
  QByteArray **ppQVar2;
  Data *pDVar3;
  QByteArray *pQVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_68;
  QArrayDataPointer<char> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size == i) {
      qVar5 = QArrayDataPointer<QByteArray>::freeSpaceAtEnd((QArrayDataPointer<QByteArray> *)this);
      if (qVar5 == 0) goto LAB_0010db4d;
      QArrayDataPointer<char>::QArrayDataPointer
                (&(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr
                  [(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.
                   size].d,&args->d);
LAB_0010dc84:
      pqVar1 = &(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size;
      *pqVar1 = *pqVar1 + 1;
      goto LAB_0010dc43;
    }
LAB_0010db4d:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QByteArray>::freeSpaceAtBegin((QArrayDataPointer<QByteArray> *)this)
      ;
      if (qVar5 != 0) {
        QArrayDataPointer<char>::QArrayDataPointer
                  (&(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.
                    ptr[-1].d,&args->d);
        ppQVar2 = &(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.
                   ptr;
        *ppQVar2 = *ppQVar2 + -1;
        goto LAB_0010dc84;
      }
    }
  }
  local_40.d = (args->d).d;
  local_40.ptr = (args->d).ptr;
  local_40.size = (args->d).size;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar6 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size != 0;
  QArrayDataPointer<QByteArray>::detachAndGrow
            ((QArrayDataPointer<QByteArray> *)this,(uint)(i == 0 && bVar6),1,(QByteArray **)0x0,
             (QArrayDataPointer<QByteArray> *)0x0);
  if (i == 0 && bVar6) {
    pQVar4 = (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr;
    pQVar4[-1].d.d = local_40.d;
    pQVar4[-1].d.ptr = local_40.ptr;
    pQVar4[-1].d.size = local_40.size;
    (this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.ptr = pQVar4 + -1
    ;
    pqVar1 = &(this->super_QGenericArrayOps<QByteArray>).super_QArrayDataPointer<QByteArray>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  else {
    Inserter::Inserter(&local_68,(QArrayDataPointer<QByteArray> *)this,i,1);
    ((local_68.displaceFrom)->d).d = local_40.d;
    ((local_68.displaceFrom)->d).ptr = local_40.ptr;
    ((local_68.displaceFrom)->d).size = local_40.size;
    local_68.displaceFrom = local_68.displaceFrom + 1;
    (local_68.data)->size = (local_68.data)->size + local_68.nInserts;
  }
  local_40.size = 0;
  local_40.ptr = (char *)0x0;
  local_40.d = (Data *)0x0;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_40);
LAB_0010dc43:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }